

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_inverse_field(secp256k1_fe *out,secp256k1_fe *x,int var)

{
  secp256k1_scalar *a;
  undefined4 extraout_EAX;
  int iVar1;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  uint32_t uVar2;
  ulong uVar3;
  int extraout_EDX;
  ulong uVar4;
  long *extraout_RDX;
  long lVar5;
  secp256k1_fe *psVar6;
  ulong uVar7;
  ulong uVar8;
  secp256k1_fe *psVar9;
  secp256k1_fe *r;
  long lVar10;
  ulong uVar11;
  secp256k1_fe *r_00;
  secp256k1_fe *psVar12;
  uchar *__s;
  ulong uVar13;
  code *pcVar14;
  size_t count;
  code *pcVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  ulong uStack_1208;
  secp256k1_fe *psStack_1200;
  uchar auStack_11f8 [4232];
  secp256k1_fe *psStack_170;
  code *pcStack_168;
  undefined8 uStack_160;
  secp256k1_fe *psStack_158;
  code *pcStack_150;
  code *pcStack_148;
  undefined1 auStack_140 [36];
  int iStack_11c;
  int iStack_118;
  int iStack_114;
  int iStack_110;
  int iStack_10c;
  int iStack_108;
  int iStack_104;
  undefined1 auStack_100 [48];
  code *pcStack_d0;
  secp256k1_fe local_c8;
  secp256k1_fe local_98;
  secp256k1_fe local_68;
  
  r = &local_c8;
  psVar6 = &local_c8;
  pcVar14 = secp256k1_fe_inv_var;
  if (var == 0) {
    pcVar14 = secp256k1_fe_inv;
  }
  pcStack_d0 = (code *)0x14d0ef;
  (*pcVar14)(&local_c8);
  if (out != (secp256k1_fe *)0x0) {
    out->n[4] = local_c8.n[4];
    out->magnitude = local_c8.magnitude;
    out->normalized = local_c8.normalized;
    out->n[2] = local_c8.n[2];
    out->n[3] = local_c8.n[3];
    out->n[0] = local_c8.n[0];
    out->n[1] = local_c8.n[1];
  }
  uVar7 = 0xffffffffffff;
  local_68.n[0] = x->n[0];
  local_68.n[1] = x->n[1];
  local_68.n[2] = x->n[2];
  local_68.n[3] = x->n[3];
  local_68.n[4] = x->n[4];
  local_68.magnitude = x->magnitude;
  local_68.normalized = x->normalized;
  psVar9 = &local_68;
  pcStack_d0 = (code *)0x14d158;
  secp256k1_fe_verify(psVar9);
  uVar3 = (local_68.n[4] >> 0x30) * 0x1000003d1 + local_68.n[0];
  if (((uVar3 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar3 & 0xfffffffffffff) == 0)) {
    uVar4 = (uVar3 >> 0x34) + local_68.n[1];
    uVar8 = (uVar4 >> 0x34) + local_68.n[2];
    uVar11 = (uVar8 >> 0x34) + local_68.n[3];
    uVar13 = (uVar11 >> 0x34) + (local_68.n[4] & 0xffffffffffff);
    if ((((uVar4 | uVar3 | uVar8 | uVar11) & 0xfffffffffffff) != 0 || uVar13 != 0) &&
       (((uVar3 | 0x1000003d0) & uVar4 & uVar8 & uVar11 & (uVar13 ^ 0xf000000000000)) !=
        0xfffffffffffff)) goto LAB_0014d1ff;
LAB_0014d5c9:
    pcStack_d0 = (code *)0x14d5d4;
    secp256k1_fe_verify(&local_c8);
    uVar7 = local_c8.n[4] & 0xffffffffffff;
    uVar3 = (local_c8.n[4] >> 0x30) * 0x1000003d1 + local_c8.n[0];
    uVar4 = (uVar3 >> 0x34) + local_c8.n[1];
    uVar8 = (uVar4 >> 0x34) + local_c8.n[2];
    r = (secp256k1_fe *)((uVar8 >> 0x34) + local_c8.n[3]);
    uVar11 = ((ulong)r >> 0x34) + uVar7;
    if ((((uVar4 | uVar3 | uVar8 | (ulong)r) & 0xfffffffffffff) == 0 && uVar11 == 0) ||
       (r_00 = (secp256k1_fe *)(uVar11 ^ 0xf000000000000), psVar6 = &local_c8,
       ((uVar3 ^ 0x1000003d0) & uVar4 & uVar8 & (ulong)r & (ulong)r_00) == 0xfffffffffffff)) {
      return;
    }
  }
  else {
LAB_0014d1ff:
    pcStack_d0 = (code *)0x14d212;
    psVar9 = x;
    secp256k1_fe_mul(&local_68,x,&local_c8);
    pcStack_d0 = (code *)0x14d21a;
    secp256k1_fe_verify(&local_68);
    r_00 = &fe_minus_one;
    pcStack_d0 = (code *)0x14d226;
    secp256k1_fe_verify(&fe_minus_one);
    if (local_68.magnitude < 0x20) {
      local_68.n[0] = local_68.n[0] + 0xffffefffffc2e;
      local_68.n[1] = local_68.n[1] + 0xfffffffffffff;
      local_68.n[2] = local_68.n[2] + 0xfffffffffffff;
      local_68.n[3] = local_68.n[3] + 0xfffffffffffff;
      local_68.n[4] = local_68.n[4] + 0xffffffffffff;
      local_68.normalized = 0;
      local_68.magnitude = local_68.magnitude + 1;
      pcStack_d0 = (code *)0x14d278;
      secp256k1_fe_verify(&local_68);
      pcStack_d0 = (code *)0x14d280;
      secp256k1_fe_verify(&local_68);
      uVar3 = (local_68.n[4] >> 0x30) * 0x1000003d1 + local_68.n[0];
      uVar4 = (uVar3 >> 0x34) + local_68.n[1];
      uVar8 = (uVar4 >> 0x34) + local_68.n[2];
      psVar9 = (secp256k1_fe *)((uVar8 >> 0x34) + local_68.n[3]);
      uVar11 = ((ulong)psVar9 >> 0x34) + (local_68.n[4] & 0xffffffffffff);
      if ((((uVar4 | uVar3 | uVar8 | (ulong)psVar9) & 0xfffffffffffff) != 0 || uVar11 != 0) &&
         (r_00 = (secp256k1_fe *)(uVar11 ^ 0xf000000000000),
         ((uVar3 ^ 0x1000003d0) & uVar4 & uVar8 & (ulong)psVar9 & (ulong)r_00) != 0xfffffffffffff))
      goto LAB_0014d667;
      local_98.n[0] = x->n[0];
      local_98.n[1] = x->n[1];
      local_98.n[2] = x->n[2];
      local_98.n[3] = x->n[3];
      local_98.n[4] = x->n[4];
      local_98.magnitude = x->magnitude;
      local_98.normalized = x->normalized;
      x = &local_98;
      pcStack_d0 = (code *)0x14d326;
      secp256k1_fe_verify(x);
      r_00 = &fe_minus_one;
      pcStack_d0 = (code *)0x14d332;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < local_98.magnitude) goto LAB_0014d66c;
      local_98.n[0] = local_98.n[0] + 0xffffefffffc2e;
      local_98.n[1] = local_98.n[1] + 0xfffffffffffff;
      local_98.n[2] = local_98.n[2] + 0xfffffffffffff;
      local_98.n[3] = local_98.n[3] + 0xfffffffffffff;
      local_98.n[4] = local_98.n[4] + 0xffffffffffff;
      local_98.normalized = 0;
      local_98.magnitude = local_98.magnitude + 1;
      pcStack_d0 = (code *)0x14d37d;
      secp256k1_fe_verify(&local_98);
      pcStack_d0 = (code *)0x14d385;
      secp256k1_fe_verify(&local_98);
      uVar3 = (local_98.n[4] >> 0x30) * 0x1000003d1 + local_98.n[0];
      if (((uVar3 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar3 & 0xfffffffffffff) == 0)) {
        uVar4 = (uVar3 >> 0x34) + local_98.n[1];
        uVar8 = (uVar4 >> 0x34) + local_98.n[2];
        uVar11 = (uVar8 >> 0x34) + local_98.n[3];
        uVar13 = (uVar11 >> 0x34) + (local_98.n[4] & 0xffffffffffff);
        if (((uVar4 | uVar3 | uVar8 | uVar11) & 0xfffffffffffff) == 0 && uVar13 == 0) {
          return;
        }
        if (((uVar3 | 0x1000003d0) & uVar4 & uVar8 & uVar11 & (uVar13 ^ 0xf000000000000)) ==
            0xfffffffffffff) {
          return;
        }
      }
      psVar9 = &local_98;
      pcStack_d0 = (code *)0x14d434;
      (*pcVar14)();
      pcStack_d0 = (code *)0x14d43f;
      secp256k1_fe_verify(&local_c8);
      r_00 = &fe_minus_one;
      pcStack_d0 = (code *)0x14d44b;
      secp256k1_fe_verify(&fe_minus_one);
      x = &local_c8;
      if (0x1f < local_c8.magnitude) goto LAB_0014d671;
      local_c8.n[0] = local_c8.n[0] + 0xffffefffffc2e;
      local_c8.n[1] = local_c8.n[1] + 0xfffffffffffff;
      local_c8.n[2] = local_c8.n[2] + 0xfffffffffffff;
      local_c8.n[3] = local_c8.n[3] + 0xfffffffffffff;
      local_c8.n[4] = local_c8.n[4] + 0xffffffffffff;
      local_c8.magnitude = local_c8.magnitude + 1;
      local_c8.normalized = 0;
      pcStack_d0 = (code *)0x14d494;
      secp256k1_fe_verify(&local_c8);
      pcStack_d0 = (code *)0x14d49d;
      (*pcVar14)(&local_c8);
      pcStack_d0 = (code *)0x14d4a5;
      secp256k1_fe_verify(&local_c8);
      local_c8.n[0] = local_c8.n[0] + 1;
      local_c8.magnitude = local_c8.magnitude + 1;
      local_c8.normalized = 0;
      pcStack_d0 = (code *)0x14d4b7;
      secp256k1_fe_verify(&local_c8);
      pcStack_d0 = (code *)0x14d4bf;
      secp256k1_fe_verify(&local_c8);
      psVar9 = &local_98;
      pcStack_d0 = (code *)0x14d4cc;
      r_00 = psVar9;
      secp256k1_fe_verify(psVar9);
      if (local_98.magnitude + local_c8.magnitude < 0x21) {
        local_c8.n[0] = local_c8.n[0] + local_98.n[0];
        local_c8.n[1] = local_c8.n[1] + local_98.n[1];
        local_c8.n[2] = local_c8.n[2] + local_98.n[2];
        local_c8.n[3] = local_c8.n[3] + local_98.n[3];
        local_c8.n[4] = local_c8.n[4] + local_98.n[4];
        local_c8.normalized = 0;
        pcStack_d0 = (code *)0x14d518;
        local_c8.magnitude = local_98.magnitude + local_c8.magnitude;
        secp256k1_fe_verify(&local_c8);
        pcStack_d0 = (code *)0x14d520;
        secp256k1_fe_verify(&local_c8);
        uVar3 = (local_c8.n[4] >> 0x30) * 0x1000003d1 + local_c8.n[0];
        if (((uVar3 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar3 & 0xfffffffffffff) == 0)) {
          uVar7 = (uVar3 >> 0x34) + local_c8.n[1];
          uVar4 = (uVar7 >> 0x34) + local_c8.n[2];
          uVar8 = (uVar4 >> 0x34) + local_c8.n[3];
          uVar11 = (uVar8 >> 0x34) + (local_c8.n[4] & 0xffffffffffff);
          if (((uVar7 | uVar3 | uVar4 | uVar8) & 0xfffffffffffff) == 0 && uVar11 == 0) {
            return;
          }
          if (((uVar3 | 0x1000003d0) & uVar7 & uVar4 & uVar8 & (uVar11 ^ 0xf000000000000)) ==
              0xfffffffffffff) {
            return;
          }
        }
        pcStack_d0 = (code *)0x14d5c9;
        test_inverse_field_cold_2();
        goto LAB_0014d5c9;
      }
    }
    else {
      pcStack_d0 = (code *)0x14d667;
      test_inverse_field_cold_7();
LAB_0014d667:
      pcStack_d0 = (code *)0x14d66c;
      test_inverse_field_cold_6();
LAB_0014d66c:
      pcStack_d0 = (code *)0x14d671;
      test_inverse_field_cold_5();
LAB_0014d671:
      r = psVar9;
      psVar6 = x;
      psVar9 = &local_68;
      pcStack_d0 = (code *)0x14d676;
      test_inverse_field_cold_4();
    }
    pcStack_d0 = (code *)0x14d67b;
    test_inverse_field_cold_3();
  }
  pcStack_d0 = test_inverse_scalar;
  test_inverse_field_cold_1();
  pcStack_d0 = (code *)0xfffffffffffff;
  psVar12 = (secp256k1_fe *)auStack_140;
  pcVar15 = secp256k1_scalar_inverse_var;
  if (extraout_EDX == 0) {
    pcVar15 = secp256k1_scalar_inverse;
  }
  pcStack_148 = (code *)0x14d6a9;
  auStack_100._32_8_ = psVar6;
  auStack_100._40_8_ = psVar9;
  (*pcVar15)(auStack_140);
  if (r_00 != (secp256k1_fe *)0x0) {
    r_00->n[2] = CONCAT44(auStack_140._20_4_,auStack_140._16_4_);
    r_00->n[3] = CONCAT44(auStack_140._28_4_,auStack_140._24_4_);
    r_00->n[0] = CONCAT44(auStack_140._4_4_,auStack_140._0_4_);
    r_00->n[1] = CONCAT44(auStack_140._12_4_,auStack_140._8_4_);
  }
  pcStack_148 = (code *)0x14d6c8;
  secp256k1_scalar_verify((secp256k1_scalar *)r);
  auVar16._0_4_ = -(uint)((int)r->n[2] == 0 && (int)r->n[0] == 0);
  auVar16._4_4_ = -(uint)(*(int *)((long)r->n + 0x14) == 0 && *(int *)((long)r->n + 4) == 0);
  auVar16._8_4_ = -(uint)((int)r->n[3] == 0 && (int)r->n[1] == 0);
  auVar16._12_4_ = -(uint)(*(int *)((long)r->n + 0x1c) == 0 && *(int *)((long)r->n + 0xc) == 0);
  iVar1 = movmskps(extraout_EAX,auVar16);
  if (iVar1 != 0xf) {
    r_00 = (secp256k1_fe *)auStack_100;
    pcStack_148 = (code *)0x14d6fc;
    secp256k1_scalar_mul
              ((secp256k1_scalar *)r_00,(secp256k1_scalar *)r,(secp256k1_scalar *)auStack_140);
    pcStack_148 = (code *)0x14d704;
    psVar6 = r_00;
    secp256k1_scalar_verify((secp256k1_scalar *)r_00);
    if (((auStack_100._0_8_ != 1 || auStack_100._8_8_ != 0) || auStack_100._16_8_ != 0) ||
        auStack_100._24_8_ != 0) {
      pcStack_148 = (code *)0x14d80e;
      test_inverse_scalar_cold_1();
      goto LAB_0014d80e;
    }
    pcStack_148 = (code *)0x14d734;
    secp256k1_scalar_add
              ((secp256k1_scalar *)(auStack_140 + 0x20),(secp256k1_scalar *)r,&scalar_minus_one);
    pcStack_148 = (code *)0x14d73c;
    secp256k1_scalar_verify((secp256k1_scalar *)(auStack_140 + 0x20));
    auVar17._0_4_ = -(uint)(iStack_110 == 0 && auStack_140._32_4_ == 0);
    auVar17._4_4_ = -(uint)(iStack_10c == 0 && iStack_11c == 0);
    auVar17._8_4_ = -(uint)(iStack_108 == 0 && iStack_118 == 0);
    auVar17._12_4_ = -(uint)(iStack_104 == 0 && iStack_114 == 0);
    iVar1 = movmskps(extraout_EAX_00,auVar17);
    if (iVar1 == 0xf) {
      return;
    }
    a = (secp256k1_scalar *)(auStack_140 + 0x20);
    pcStack_148 = (code *)0x14d76d;
    (*pcVar15)(a,a);
    pcStack_148 = (code *)0x14d782;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_140,&scalar_minus_one,(secp256k1_scalar *)auStack_140);
    pcStack_148 = (code *)0x14d78b;
    (*pcVar15)(auStack_140,auStack_140);
    pcStack_148 = (code *)0x14d79d;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_140,(secp256k1_scalar *)auStack_140,&secp256k1_scalar_one
              );
    pcStack_148 = (code *)0x14d7ab;
    secp256k1_scalar_add((secp256k1_scalar *)auStack_140,a,(secp256k1_scalar *)auStack_140);
    pcStack_148 = (code *)0x14d7b3;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_140);
    auVar18._0_4_ = -(uint)(auStack_140._16_4_ == 0 && auStack_140._0_4_ == 0);
    auVar18._4_4_ = -(uint)(auStack_140._20_4_ == 0 && auStack_140._4_4_ == 0);
    auVar18._8_4_ = -(uint)(auStack_140._24_4_ == 0 && auStack_140._8_4_ == 0);
    auVar18._12_4_ = -(uint)(auStack_140._28_4_ == 0 && auStack_140._12_4_ == 0);
    iVar1 = movmskps(extraout_EAX_01,auVar18);
    if (iVar1 == 0xf) {
      return;
    }
    pcStack_148 = (code *)0x14d7d7;
    test_inverse_scalar_cold_2();
    r_00 = (secp256k1_fe *)auStack_140;
  }
  pcStack_148 = (code *)0x14d7e2;
  secp256k1_scalar_verify((secp256k1_scalar *)auStack_140);
  auVar19._0_4_ = -(uint)(auStack_140._16_4_ == 0 && auStack_140._0_4_ == 0);
  auVar19._4_4_ = -(uint)(auStack_140._20_4_ == 0 && auStack_140._4_4_ == 0);
  auVar19._8_4_ = -(uint)(auStack_140._24_4_ == 0 && auStack_140._8_4_ == 0);
  auVar19._12_4_ = -(uint)(auStack_140._28_4_ == 0 && auStack_140._12_4_ == 0);
  iVar1 = movmskps(extraout_EAX_02,auVar19);
  r = (secp256k1_fe *)auStack_140;
  psVar6 = psVar12;
  if (iVar1 == 0xf) {
    return;
  }
LAB_0014d80e:
  pcStack_148 = test_hsort;
  test_inverse_scalar_cold_3();
  uStack_160 = 0x1000003d1;
  __s = auStack_11f8;
  psStack_170 = r;
  pcStack_168 = pcVar14;
  psStack_158 = r_00;
  pcStack_150 = pcVar15;
  pcStack_148 = (code *)uVar7;
  memset(__s,0,0x1081);
  uStack_1208 = 0;
  lVar10 = 0x41;
  psStack_1200 = psVar6;
  secp256k1_hsort(__s,0x41,(size_t)psVar6,test_hsort_cmp,&uStack_1208);
  if (0x3f < uStack_1208) {
    test_hsort_is_sorted(auStack_11f8,0x41,(size_t)psVar6);
    if (0 < COUNT) {
      iVar1 = 0;
      do {
        uVar2 = testrand_int(0x41);
        count = (size_t)(int)uVar2;
        testrand_bytes_test(auStack_11f8,count * (long)psVar6);
        secp256k1_hsort(auStack_11f8,count,(size_t)psVar6,test_hsort_cmp,&uStack_1208);
        test_hsort_is_sorted(auStack_11f8,count,(size_t)psVar6);
        iVar1 = iVar1 + 1;
      } while (iVar1 < COUNT);
    }
    return;
  }
  test_hsort_cold_1();
  *extraout_RDX = *extraout_RDX + 1;
  if (extraout_RDX[1] != 0) {
    lVar5 = 0;
    do {
      if (__s[lVar5] != *(uchar *)(lVar10 + lVar5)) {
        return;
      }
      lVar5 = lVar5 + 1;
    } while (extraout_RDX[1] != lVar5);
  }
  return;
}

Assistant:

static void test_inverse_field(secp256k1_fe* out, const secp256k1_fe* x, int var)
{
    secp256k1_fe l, r, t;

    (var ? secp256k1_fe_inv_var : secp256k1_fe_inv)(&l, x) ;   /* l = 1/x */
    if (out) *out = l;
    t = *x;                                                    /* t = x */
    if (secp256k1_fe_normalizes_to_zero_var(&t)) {
        CHECK(secp256k1_fe_normalizes_to_zero(&l));
        return;
    }
    secp256k1_fe_mul(&t, x, &l);                               /* t = x*(1/x) */
    secp256k1_fe_add(&t, &fe_minus_one);                       /* t = x*(1/x)-1 */
    CHECK(secp256k1_fe_normalizes_to_zero(&t));                /* x*(1/x)-1 == 0 */
    r = *x;                                                    /* r = x */
    secp256k1_fe_add(&r, &fe_minus_one);                       /* r = x-1 */
    if (secp256k1_fe_normalizes_to_zero_var(&r)) return;
    (var ? secp256k1_fe_inv_var : secp256k1_fe_inv)(&r, &r);   /* r = 1/(x-1) */
    secp256k1_fe_add(&l, &fe_minus_one);                       /* l = 1/x-1 */
    (var ? secp256k1_fe_inv_var : secp256k1_fe_inv)(&l, &l);   /* l = 1/(1/x-1) */
    secp256k1_fe_add_int(&l, 1);                               /* l = 1/(1/x-1)+1 */
    secp256k1_fe_add(&l, &r);                                  /* l = 1/(1/x-1)+1 + 1/(x-1) */
    CHECK(secp256k1_fe_normalizes_to_zero_var(&l));            /* l == 0 */
}